

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactNodeXYZ::ComputeJacobianForContactPart
          (ChContactNodeXYZ *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  ChRowVectorRef local_100;
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
  local_e0;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_a8;
  ChMatrix33<double> Jx1;
  
  local_e0.
  super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
  .
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>,_0>
  .m_data = (PointerType)contact_plane;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jx1,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_e0);
  if (!second) {
    local_e0.
    super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
    .
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>,_0>
    .m_data = (PointerType)&DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jx1,(Scalar *)&local_e0);
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_a8,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Get_Cq
            (&local_100,jacobian_tuple_N);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_e0,&local_100,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_e0.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_a8,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Get_Cq
            (&local_100,jacobian_tuple_U);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_e0,&local_100,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_e0.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_a8,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Get_Cq
            (&local_100,jacobian_tuple_V);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_e0,&local_100,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_e0.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_a8);
  return;
}

Assistant:

void ChContactNodeXYZ::ComputeJacobianForContactPart(const ChVector<>& abs_point,
                                                     ChMatrix33<>& contact_plane,
                                                     type_constraint_tuple& jacobian_tuple_N,
                                                     type_constraint_tuple& jacobian_tuple_U,
                                                     type_constraint_tuple& jacobian_tuple_V,
                                                     bool second) {
    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq().segment(0, 3) = Jx1.row(2);
}